

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httphandler.cpp
# Opt level: O0

void __thiscall HttpHandler::parseURL(HttpHandler *this,char *request_uri)

{
  char *pcVar1;
  char *__s;
  wchar_t wVar2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *puVar3;
  size_t sVar4;
  mapped_type *pmVar5;
  allocator<char> local_179;
  key_type local_178;
  allocator<char> local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  allocator<char> local_119;
  key_type local_118;
  char *local_f8;
  char *buffer;
  UriQueryListA **current;
  UriQueryListA *pUStack_e0;
  int itemCount;
  UriQueryListA *queryList;
  UriUriA uri;
  UriParserStateA state;
  char *request_uri_local;
  HttpHandler *this_local;
  
  puVar3 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)operator_new(0x38);
  memset(puVar3,0,0x38);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(puVar3);
  this->parameter = puVar3;
  uri.reserved = &queryList;
  if (request_uri != (char *)0x0) {
    wVar2 = uriParseUriA((UriParserStateA_conflict *)&uri.reserved,request_uri);
    if (wVar2 == L'\0') {
      wVar2 = uriDissectQueryMallocA
                        (&stack0xffffffffffffff20,(wchar_t *)((long)&current + 4),
                         (char *)uri.pathTail,uri.query.first);
      if (wVar2 == L'\0') {
        buffer = (char *)&stack0xffffffffffffff20;
        do {
          if (pUStack_e0->value == (char *)0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"",&local_151);
            puVar3 = this->parameter;
            pcVar1 = pUStack_e0->key;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_178,pcVar1,&local_179);
            pmVar5 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](puVar3,&local_178);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(pmVar5,&local_150);
            std::__cxx11::string::~string((string *)&local_178);
            std::allocator<char>::~allocator(&local_179);
            std::__cxx11::string::~string((string *)&local_150);
            std::allocator<char>::~allocator(&local_151);
          }
          else {
            sVar4 = strlen(pUStack_e0->value);
            local_f8 = (char *)operator_new__(sVar4 + 1);
            strcpy(local_f8,pUStack_e0->value);
            uriUnescapeInPlaceExA(local_f8,0,URI_BR_DONT_TOUCH);
            __s = local_f8;
            puVar3 = this->parameter;
            pcVar1 = pUStack_e0->key;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_118,pcVar1,&local_119);
            pmVar5 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](puVar3,&local_118);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(pmVar5,__s);
            std::__cxx11::string::~string((string *)&local_118);
            std::allocator<char>::~allocator(&local_119);
            if (local_f8 != (char *)0x0) {
              operator_delete__(local_f8);
            }
          }
          *(UriQueryListStructA **)buffer = pUStack_e0->next;
        } while (*(long *)buffer != 0);
        uriFreeQueryListA(pUStack_e0);
        uriFreeUriMembersA((UriUriA *)&queryList);
      }
    }
    else {
      uriFreeUriMembersA((UriUriA *)&queryList);
    }
  }
  return;
}

Assistant:

void HttpHandler::parseURL(const char *request_uri)
{
    this->parameter = new std::unordered_map<std::string, std::string>();
    UriParserStateA state;
    UriUriA uri;
    state.uri = &uri;

    if (request_uri == nullptr)
    {
        return;
    }

    if (uriParseUriA(&state, request_uri) != URI_SUCCESS)
    {
        uriFreeUriMembersA(&uri);
        return;
    }

    UriQueryListA *queryList;
    int itemCount;

    if (uriDissectQueryMallocA(&queryList, &itemCount, uri.query.first, uri.query.afterLast) == URI_SUCCESS)
    {
        auto &current = queryList;

        do
        {
            if (queryList->value != nullptr)
            {
                auto buffer = new char[std::strlen(queryList->value) + 1];
                std::strcpy(buffer, (char *)queryList->value);

                uriUnescapeInPlaceExA(buffer, false, URI_BR_DONT_TOUCH);
                (*this->parameter)[queryList->key] = buffer;
                delete[] buffer;
            }
            else
            {
                (*this->parameter)[queryList->key] = std::string("");
            }

            current = queryList->next;
        } while (current != nullptr);

        uriFreeQueryListA(queryList);
        uriFreeUriMembersA(&uri);
        return;
    }
}